

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RSI;
  ostream *in_RDI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value;
  allocator<wchar_t> local_31;
  wstring local_30 [16];
  undefined8 in_stack_ffffffffffffffe0;
  wchar_t *in_stack_ffffffffffffffe8;
  
  if (in_RDI == (ostream *)0x0) {
    std::operator<<((ostream *)in_RSI,"NULL");
  }
  else {
    value = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&local_31;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              (in_RSI,in_stack_ffffffffffffffe8,(allocator<wchar_t> *)in_stack_ffffffffffffffe0);
    UniversalPrint<std::__cxx11::wstring>(value,in_RDI);
    std::__cxx11::wstring::~wstring(local_30);
    std::allocator<wchar_t>::~allocator(&local_31);
  }
  return;
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }